

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O2

Lookups * verona::lookdown(Lookups *__return_storage_ptr__,Lookup *lookup,Node *id,Node *ta,
                          NodeSet *visited)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  TokenDef *pTVar3;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  iterator iVar6;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  pair<std::_Rb_tree_iterator<std::shared_ptr<trieste::NodeDef>_>,_bool> pVar8;
  Lookup l;
  Nodes defs;
  Lookups ldefs;
  undefined1 local_178 [72];
  Nodes local_130;
  undefined1 local_118 [80];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_80;
  insert_iterator<std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>_>
  local_70;
  _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::_Identity<std::shared_ptr<trieste::NodeDef>_>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
  local_60;
  
LAB_00137a05:
LAB_00137a0d:
  do {
    if (((lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (element_type *)0x0) ||
       (pVar8 = ::std::
                _Rb_tree<std::shared_ptr<trieste::NodeDef>,std::shared_ptr<trieste::NodeDef>,std::_Identity<std::shared_ptr<trieste::NodeDef>>,std::owner_less<void>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
                ::_M_insert_unique<std::shared_ptr<trieste::NodeDef>const&>
                          ((_Rb_tree<std::shared_ptr<trieste::NodeDef>,std::shared_ptr<trieste::NodeDef>,std::_Identity<std::shared_ptr<trieste::NodeDef>>,std::owner_less<void>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
                            *)visited,&lookup->def),
       ((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
LAB_00137be0:
      p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      return __return_storage_ptr__;
    }
    local_178._0_8_ = Class;
    local_178._8_8_ = Trait;
    local_178._16_8_ = Function;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
    local_118._0_8_ = (element_type *)local_178;
    bVar5 = trieste::Token::in(&((lookup->def).
                                 super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->type_,(initializer_list<trieste::Token> *)local_118);
    if (bVar5) {
      p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      trieste::NodeDef::lookdown
                (&local_130,
                 (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&((id->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->location_);
      local_70.iter._M_node =
           (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_70.container = __return_storage_ptr__;
      for (; local_130.
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_130.
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          local_130.
          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)(&(local_130.
                           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> + 1)) {
        ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_80,
                   &(local_130.
                     super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
        Lookup::make((Lookup *)local_178,lookup,(Node *)&local_80);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
        ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_90,&ta->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
        apply_typeargs((Lookup *)local_178,(Node *)&local_90);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
        Lookup::Lookup((Lookup *)local_118,(Lookup *)local_178);
        Lookup::~Lookup((Lookup *)local_178);
        ::std::
        insert_iterator<std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>_>
        ::operator=(&local_70,(Lookup *)local_118);
        Lookup::~Lookup((Lookup *)local_118);
      }
      ::std::
      vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
      ::~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 *)&local_130);
      return __return_storage_ptr__;
    }
    peVar2 = (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pTVar3 = (peVar2->type_).def;
    if (pTVar3 == (TokenDef *)TypeAlias) {
      local_118._0_8_ = Type;
      trieste::operator/((WFLookup *)local_178,&lookup->def,(Token *)local_118);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)lookup,
                 (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8));
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 0x10));
      goto LAB_00137a0d;
    }
    if (pTVar3 != (TokenDef *)TypeParam) {
      if (pTVar3 == (TokenDef *)Type) {
        p_Var7 = &((peVar2->children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
      }
      else {
        local_118._0_8_ = FQType;
        local_118._8_8_ = FQFunction;
        local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
        local_178._0_8_ = (element_type *)local_118;
        bVar5 = trieste::Token::in(&peVar2->type_,(initializer_list<trieste::Token> *)local_178);
        if (bVar5) break;
        peVar2 = (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pTVar3 = (peVar2->type_).def;
        if (pTVar3 != (TokenDef *)TypeView) {
          if (pTVar3 != (TokenDef *)TypeIsect) {
            if (pTVar3 != (TokenDef *)TypeUnion) {
              local_178._0_8_ = TypeList;
              local_178._8_8_ = TypeTuple;
              local_178._16_8_ = TypeVar;
              local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
              local_118._0_8_ = (element_type *)local_178;
              trieste::Token::in(&peVar2->type_,(initializer_list<trieste::Token> *)local_118);
            }
            p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
            *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
            *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header =
                 0;
            (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var1->_M_header;
            (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var1->_M_header;
            (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
            return __return_storage_ptr__;
          }
          p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var1->_M_header;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var1->_M_header;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
          p_Var4 = *(__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> **)
                    ((long)&(peVar2->children).
                            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                            ._M_impl.super__Vector_impl_data + 8);
          for (p_Var7 = &((peVar2->children).
                          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
              p_Var7 != p_Var4; p_Var7 = p_Var7 + 1) {
            ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_b0,p_Var7);
            Lookup::make((Lookup *)local_178,lookup,(Node *)&local_b0);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_b0._M_refcount);
            ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_c0,
                       &id->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
            ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                       (local_118 + 0x48),
                       &ta->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
            ::std::
            _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::_Identity<std::shared_ptr<trieste::NodeDef>_>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ::_Rb_tree(&local_60,&visited->_M_t);
            lookdown((Lookups *)local_118,(Lookup *)local_178,(Node *)&local_c0,
                     (Node *)(local_118 + 0x48),(NodeSet *)&local_60);
            ::std::
            _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::_Identity<std::shared_ptr<trieste::NodeDef>_>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ::~_Rb_tree(&local_60);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_c0._M_refcount);
            ::std::
            _Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<verona::Lookup>>
                      ((_Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>
                        *)__return_storage_ptr__,
                       (_Rb_tree_const_iterator<verona::Lookup>)local_118._24_8_,
                       (_Base_ptr)(local_118 + 8));
            ::std::
            _Rb_tree<verona::Lookup,_verona::Lookup,_std::_Identity<verona::Lookup>,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
            ::~_Rb_tree((_Rb_tree<verona::Lookup,_verona::Lookup,_std::_Identity<verona::Lookup>,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
                         *)local_118);
            Lookup::~Lookup((Lookup *)local_178);
          }
          return __return_storage_ptr__;
        }
        p_Var7 = &(*(pointer *)
                    ((long)&(peVar2->children).
                            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                            ._M_impl.super__Vector_impl_data + 8))[-1].
                  super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
      }
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)lookup,p_Var7);
      goto LAB_00137a0d;
    }
    iVar6 = ::std::
            _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
            ::find(&(lookup->bindings)._M_t,&lookup->def);
    if (((_Rb_tree_header *)iVar6._M_node == &(lookup->bindings)._M_t._M_impl.super__Rb_tree_header)
       || ((iVar6._M_node[1]._M_left)->_M_left == (_Base_ptr)TypeParamBind)) goto LAB_00137be0;
    ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)lookup,
               (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
               &iVar6._M_node[1]._M_left);
  } while( true );
  ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,(__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)lookup);
  resolve_fq((Lookup *)local_178,(Node *)&local_a0);
  Lookup::operator=(lookup,(Lookup *)local_178);
  Lookup::~Lookup((Lookup *)local_178);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  goto LAB_00137a05;
}

Assistant:

Lookups lookdown(Lookup& lookup, Node id, Node ta, NodeSet visited)
  {
    while (true)
    {
      // Stop on a failed lookup.
      if (!lookup.def)
        return {};

      // Check if we've visited this node before. If so, we've found a cycle.
      auto inserted = visited.insert(lookup.def);
      if (!inserted.second)
        return {};

      if (lookup.def->in({Class, Trait, Function}))
      {
        // Return all lookdowns in the found class, trait, or function.
        Lookups result;
        auto defs = lookup.def->lookdown(id->location());

        std::transform(
          defs.begin(),
          defs.end(),
          std::inserter(result, result.begin()),
          [&](auto& def) {
            auto l = lookup.make(def);
            apply_typeargs(l, ta);
            return l;
          });

        return result;
      }
      else if (lookup.def == TypeAlias)
      {
        // Replace the def with our type alias and try again.
        lookup.def = lookup.def / Type;
      }
      else if (lookup.def == TypeParam)
      {
        // Replace the typeparam with the bound typearg and try again.
        auto it = lookup.bindings.find(lookup.def);

        // Except in testing, there should always be a binding. If it's bound
        // to itself, then we're done.
        if ((it == lookup.bindings.end()) || (it->second == TypeParamBind))
          return {};

        lookup.def = it->second;
      }
      // The remainder of cases arise from a Use, a TypeAlias, or a TypeParam.
      // They will all result in some number of name resolutions.
      else if (lookup.def == Type)
      {
        // Replace the def with the content of the type and try again.
        // Use `front()` instead of `def / Type` to allow looking up in `use`
        // directives before Type is no longer a sequence.
        lookup.def = lookup.def->front();
      }
      else if (lookup.def->in({FQType, FQFunction}))
      {
        // Resolve the name and try again.
        lookup = resolve_fq(lookup.def);
      }
      else if (lookup.def == TypeView)
      {
        // Replace the def with the rhs of the view and try again.
        lookup.def = lookup.def->back();
      }
      else if (lookup.def == TypeIsect)
      {
        // Return everything we find.
        Lookups result;

        for (auto& t : *lookup.def)
        {
          auto l = lookup.make(t);
          auto ldefs = lookdown(l, id, ta, visited);
          result.insert(ldefs.begin(), ldefs.end());
        }

        return result;
      }
      else if (lookup.def == TypeUnion)
      {
        // TODO: return only things that are identical in all disjunctions
        return {};
      }
      else if (lookup.def->in({TypeList, TypeTuple, TypeVar}))
      {
        // Nothing to do here.
        return {};
      }
      else
      {
        // This type isn't resolved yet.
        return {};
      }
    }
  }